

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_impl::update_torrent_info_hash
          (session_impl *this,shared_ptr<libtorrent::aux::torrent> *t,info_hash_t *old_ih)

{
  shared_ptr<libtorrent::aux::torrent> local_20;
  
  torrent_list<libtorrent::aux::torrent>::erase(&this->m_torrents,old_ih);
  local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (t->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
          _M_pi;
  if (local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count =
           (local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  torrent_list<libtorrent::aux::torrent>::insert
            (&this->m_torrents,
             &(local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->m_info_hash,&local_20);
  if (local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void session_impl::update_torrent_info_hash(std::shared_ptr<torrent> const& t
		, info_hash_t const& old_ih)
	{
		m_torrents.erase(old_ih);
		m_torrents.insert(t->info_hash(), t);
	}